

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

bool vkt::image::anon_unknown_2::isOrderIndependentAtomicOperation(AtomicOperation op)

{
  undefined1 local_d;
  AtomicOperation op_local;
  
  local_d = true;
  if ((((op != ATOMIC_OPERATION_ADD) && (local_d = true, op != ATOMIC_OPERATION_MIN)) &&
      (local_d = true, op != ATOMIC_OPERATION_MAX)) &&
     ((local_d = true, op != ATOMIC_OPERATION_AND && (local_d = true, op != ATOMIC_OPERATION_OR))))
  {
    local_d = op == ATOMIC_OPERATION_XOR;
  }
  return local_d;
}

Assistant:

static bool isOrderIndependentAtomicOperation (const AtomicOperation op)
{
	return	op == ATOMIC_OPERATION_ADD ||
			op == ATOMIC_OPERATION_MIN ||
			op == ATOMIC_OPERATION_MAX ||
			op == ATOMIC_OPERATION_AND ||
			op == ATOMIC_OPERATION_OR ||
			op == ATOMIC_OPERATION_XOR;
}